

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_info.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_type sVar5;
  reference this;
  reference this_00;
  reference this_01;
  uint32_t entry_j_start;
  uint32_t entry_i_end;
  uint32_t entry_i_start;
  value_type *entry_j;
  value_type *entry_i;
  uint j;
  uint i;
  MzpArchiveEntry *header;
  iterator __end1;
  iterator __begin1;
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *__range1;
  Mzp mzp;
  string local_38 [8];
  string archive_data;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    std::__cxx11::string::string(local_38);
    bVar1 = mg::fs::read_file(argv[1],(string *)local_38);
    if (bVar1) {
      mg::data::Mzp::Mzp((Mzp *)&__range1);
      bVar1 = mg::data::mzp_read((string *)local_38,(Mzp *)&__range1);
      __stream = _stderr;
      if (bVar1) {
        sVar5 = std::
                vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ::size((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                        *)&mzp);
        fprintf(__stream,"MZP archive of %lu elements:\n",sVar5);
        __end1 = std::
                 vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ::begin((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          *)&mzp);
        header = (MzpArchiveEntry *)
                 std::
                 vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ::end((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                        *)&mzp);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
                                           *)&header), bVar1) {
          this = __gnu_cxx::
                 __normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
                 ::operator*(&__end1);
          mg::data::Mzp::MzpArchiveEntry::print(this);
          __gnu_cxx::
          __normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
          ::operator++(&__end1);
        }
        for (entry_i._4_4_ = 0;
            sVar5 = std::
                    vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ::size((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            *)&mzp), entry_i._0_4_ = entry_i._4_4_, entry_i._4_4_ < sVar5;
            entry_i._4_4_ = entry_i._4_4_ + 1) {
          while( true ) {
            entry_i._0_4_ = (uint)entry_i + 1;
            sVar5 = std::
                    vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ::size((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            *)&mzp);
            if (sVar5 <= (uint)entry_i) break;
            this_00 = std::
                      vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                      ::operator[]((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                    *)&mzp,(ulong)entry_i._4_4_);
            this_01 = std::
                      vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                      ::operator[]((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                    *)&mzp,(ulong)(uint)entry_i);
            uVar2 = mg::data::Mzp::MzpArchiveEntry::data_offset_relative(this_00);
            uVar3 = mg::data::Mzp::MzpArchiveEntry::entry_data_size(this_00);
            uVar4 = mg::data::Mzp::MzpArchiveEntry::data_offset_relative(this_01);
            if ((uVar2 <= uVar4) && (uVar4 <= uVar2 + uVar3)) {
              fprintf(_stderr,"Entry %u begins inside of entry %u\n",(ulong)(uint)entry_i,
                      (ulong)entry_i._4_4_);
            }
          }
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Failed to parse archive\n");
        argv_local._4_4_ = -1;
      }
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      mg::data::Mzp::~Mzp((Mzp *)&__range1);
    }
    else {
      argv_local._4_4_ = -1;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::__cxx11::string::~string(local_38);
  }
  else {
    fprintf(_stderr,"%s infile\n",*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    fprintf(stderr, "%s infile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  fprintf(stderr, "MZP archive of %lu elements:\n", mzp.entry_headers.size());
  for (auto &header : mzp.entry_headers) {
    header.print();
  }

  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    for (unsigned j = i + 1; j < mzp.entry_headers.size(); j++) {
      // Do these ranges overlap
      auto &entry_i = mzp.entry_headers[i];
      auto &entry_j = mzp.entry_headers[j];
      const uint32_t entry_i_start = entry_i.data_offset_relative();
      const uint32_t entry_i_end = entry_i_start + entry_i.entry_data_size();
      const uint32_t entry_j_start = entry_j.data_offset_relative();
      if (entry_j_start >= entry_i_start && entry_j_start <= entry_i_end) {
        fprintf(stderr, "Entry %u begins inside of entry %u\n", j, i);
      }
    }
  }

  return 0;
}